

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void dequantize_row_iq2_s(block_iq2_s *x,float *y,int64_t k)

{
  float fVar1;
  byte bVar2;
  byte bVar3;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar4;
  int j;
  uint8_t *grid;
  float dl;
  int l;
  int ib32;
  uint8_t *signs;
  uint8_t *qh;
  uint8_t *qs;
  float d;
  int i;
  float db [2];
  int64_t nb;
  float local_68;
  int local_64;
  int local_50;
  int local_4c;
  long local_48;
  long local_38;
  int local_2c;
  float local_28 [2];
  long local_20;
  long local_10;
  long local_8;
  
  local_20 = in_RDX / 0x100;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_2c = 0; local_2c < local_20; local_2c = local_2c + 1) {
    fVar4 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(local_8 + (long)local_2c * 0x52));
    local_48 = local_8 + (long)local_2c * 0x52;
    local_38 = local_48 + 2;
    local_48 = local_48 + 0x22;
    for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
      local_28[0] = fVar4 * ((float)(*(byte *)(local_8 + (long)local_2c * 0x52 + 0x4a +
                                              (long)local_4c) & 0xf) + 0.5) * 0.25;
      local_28[1] = fVar4 * ((float)((int)(uint)*(byte *)(local_8 + (long)local_2c * 0x52 + 0x4a +
                                                         (long)local_4c) >> 4) + 0.5) * 0.25;
      for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
        fVar1 = local_28[local_50 / 2];
        bVar2 = *(byte *)(local_38 + local_50);
        bVar3 = *(byte *)(local_8 + (long)local_2c * 0x52 + 0x42 + (long)local_4c);
        for (local_64 = 0; local_64 < 8; local_64 = local_64 + 1) {
          local_68 = -1.0;
          if ((*(byte *)(local_48 + local_50) & kmask_iq2xs[local_64]) == 0) {
            local_68 = 1.0;
          }
          *(float *)(local_10 + (long)local_64 * 4) =
               fVar1 * (float)*(byte *)((long)iq2s_grid +
                                       (long)local_64 +
                                       (long)(int)((uint)bVar2 |
                                                  (uint)bVar3 << ((char)local_50 * -2 + 8U & 0x1f) &
                                                  0x300) * 8) * local_68;
        }
        local_10 = local_10 + 0x20;
      }
      local_38 = local_38 + 4;
      local_48 = local_48 + 4;
    }
  }
  return;
}

Assistant:

void dequantize_row_iq2_s(const block_iq2_s * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    float db[2];

    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d);
        const uint8_t * qs = x[i].qs;
        const uint8_t * qh = x[i].qh;
        const uint8_t * signs = qs + QK_K/8;

        for (int ib32 = 0; ib32 < QK_K/32; ++ib32) {
            db[0] = d * (0.5f + (x[i].scales[ib32] & 0xf)) * 0.25f;
            db[1] = d * (0.5f + (x[i].scales[ib32] >>  4)) * 0.25f;
            for (int l = 0; l < 4; ++l) {
                const float dl = db[l/2];
                const uint8_t * grid = (const uint8_t *)(iq2s_grid + (qs[l] | (qh[ib32] << (8-2*l) & 0x300)));
                for (int j = 0; j < 8; ++j) {
                    y[j] = dl * grid[j] * (signs[l] & kmask_iq2xs[j] ? -1.f : 1.f);
                }
                y += 8;
            }
            qs += 4;
            signs += 4;
        }
    }
}